

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

CivilInfo * absl::lts_20250127::anon_unknown_8::InfinitePastCivilInfo(void)

{
  CivilInfo *in_RDI;
  civil_time<absl::lts_20250127::time_internal::second_tag> cVar1;
  Duration DVar2;
  CivilInfo *ci;
  HiRep local_60;
  uint32_t local_58;
  int_least64_t local_18;
  undefined8 uStack_10;
  
  TimeZone::CivilInfo::CivilInfo(in_RDI);
  cVar1 = time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>::
          min();
  local_18 = cVar1.f_.y;
  uStack_10 = cVar1.f_._8_8_;
  (in_RDI->cs).f_.y = local_18;
  (in_RDI->cs).f_.m = (undefined1)uStack_10;
  (in_RDI->cs).f_.d = uStack_10._1_1_;
  (in_RDI->cs).f_.hh = uStack_10._2_1_;
  (in_RDI->cs).f_.mm = uStack_10._3_1_;
  (in_RDI->cs).f_.ss = uStack_10._4_1_;
  *(undefined3 *)&(in_RDI->cs).f_.field_0xd = uStack_10._5_3_;
  DVar2 = InfiniteDuration();
  DVar2 = lts_20250127::operator-(DVar2);
  local_60 = DVar2.rep_hi_;
  local_58 = DVar2.rep_lo_;
  (in_RDI->subsecond).rep_hi_ = local_60;
  (in_RDI->subsecond).rep_lo_ = local_58;
  in_RDI->offset = 0;
  in_RDI->is_dst = false;
  in_RDI->zone_abbr = "-00";
  return in_RDI;
}

Assistant:

inline absl::TimeZone::CivilInfo InfinitePastCivilInfo() {
  TimeZone::CivilInfo ci;
  ci.cs = CivilSecond::min();
  ci.subsecond = -InfiniteDuration();
  ci.offset = 0;
  ci.is_dst = false;
  ci.zone_abbr = "-00";
  return ci;
}